

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::AddBranchToBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *parent_block,
          uint32_t branch_destination)

{
  InstructionBuilder builder;
  InstructionBuilder local_30;
  
  InstructionBuilder::InstructionBuilder
            (&local_30,(this->super_Pass).context_,parent_block,
             (uint)(anonymous_namespace)::kAnalysisDefUseAndInstrToBlockMapping * 3);
  InstructionBuilder::AddBranch(&local_30,branch_destination);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::AddBranchToBlock(
    BasicBlock* parent_block, uint32_t branch_destination) const {
  InstructionBuilder builder{context(), parent_block,
                             kAnalysisDefUseAndInstrToBlockMapping};
  builder.AddBranch(branch_destination);
}